

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-math.c
# Opt level: O1

PVG_FT_Angle PVG_FT_Atan2(PVG_FT_Fixed dx,PVG_FT_Fixed dy)

{
  uint uVar1;
  long lVar2;
  byte bVar3;
  uint uVar4;
  long lVar5;
  PVG_FT_Vector v;
  PVG_FT_Vector local_18;
  
  if (dy != 0 || dx != 0) {
    lVar2 = -dx;
    if (0 < dx) {
      lVar2 = dx;
    }
    lVar5 = -dy;
    if (0 < dy) {
      lVar5 = dy;
    }
    uVar4 = (uint)lVar5 | (uint)lVar2;
    uVar1 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    if (uVar1 < 0x1e) {
      bVar3 = 0x1d - (byte)uVar1;
      local_18.x = dx << (bVar3 & 0x3f);
      local_18.y = dy << (bVar3 & 0x3f);
    }
    else {
      bVar3 = 2 - ((byte)uVar1 ^ 0x1f);
      local_18.x = dx >> (bVar3 & 0x3f);
      local_18.y = dy >> (bVar3 & 0x3f);
    }
    ft_trig_pseudo_polarize(&local_18);
    return local_18.y;
  }
  return 0;
}

Assistant:

PVG_FT_Angle PVG_FT_Atan2(PVG_FT_Fixed dx, PVG_FT_Fixed dy)
{
    PVG_FT_Vector v;

    if (dx == 0 && dy == 0) return 0;

    v.x = dx;
    v.y = dy;
    ft_trig_prenorm(&v);
    ft_trig_pseudo_polarize(&v);

    return v.y;
}